

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::setItemAlignment(QListView *this,Alignment alignment)

{
  long lVar1;
  bool bVar2;
  ViewMode VVar3;
  Flow FVar4;
  QListViewPrivate *pQVar5;
  QFlags<Qt::AlignmentFlag> in_ESI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QListViewPrivate *d;
  int delay;
  QAbstractItemViewPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar5 = d_func((QListView *)0x87f78e);
  bVar2 = ::operator==((QFlags<Qt::AlignmentFlag>)
                       (pQVar5->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i,in_ESI);
  if (!bVar2) {
    (pQVar5->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (Int)in_ESI.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
              super_QFlagsStorage<Qt::AlignmentFlag>.i;
    VVar3 = viewMode((QListView *)in_RDI);
    delay = (int)((ulong)pQVar5 >> 0x20);
    if (((VVar3 == ListMode) && (FVar4 = flow((QListView *)in_RDI), FVar4 == TopToBottom)) &&
       (bVar2 = isWrapping((QListView *)in_RDI), bVar2)) {
      QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,delay);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::setItemAlignment(Qt::Alignment alignment)
{
    Q_D(QListView);
    if (d->itemAlignment == alignment)
        return;
    d->itemAlignment = alignment;
    if (viewMode() == ListMode && flow() == QListView::TopToBottom && isWrapping())
        d->doDelayedItemsLayout();
}